

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

int ChildWindowComparer(void *lhs,void *rhs)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  
  uVar1 = *(uint *)(*lhs + 0xc);
  uVar2 = *(uint *)(*rhs + 0xc);
  iVar3 = (uVar1 & 0x4000000) - (uVar2 & 0x4000000);
  if ((iVar3 == 0) && (iVar3 = (uVar1 & 0x2000000) - (uVar2 & 0x2000000), iVar3 == 0)) {
    return (int)*(short *)(*lhs + 0x9c) - (int)*(short *)(*rhs + 0x9c);
  }
  return iVar3;
}

Assistant:

static int IMGUI_CDECL ChildWindowComparer(const void* lhs, const void* rhs)
{
    const ImGuiWindow* const a = *(const ImGuiWindow* const *)lhs;
    const ImGuiWindow* const b = *(const ImGuiWindow* const *)rhs;
    if (int d = (a->Flags & ImGuiWindowFlags_Popup) - (b->Flags & ImGuiWindowFlags_Popup))
        return d;
    if (int d = (a->Flags & ImGuiWindowFlags_Tooltip) - (b->Flags & ImGuiWindowFlags_Tooltip))
        return d;
    return (a->BeginOrderWithinParent - b->BeginOrderWithinParent);
}